

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O0

void __thiscall Scs::Server::~Server(Server *this)

{
  bool bVar1;
  Server *this_local;
  
  (this->super_IServer)._vptr_IServer = (_func_int **)&PTR__Server_00129ae8;
  LogWriteLine("Shutting down server.");
  std::atomic<bool>::operator=(&this->m_shutDown,true);
  bVar1 = std::thread::joinable(&this->m_thread);
  if (bVar1) {
    std::thread::join();
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Scs::Allocator<char>_>::~basic_string
            (&this->m_port);
  std::function<void_(Scs::IServer_&)>::~function(&this->m_onUpdate);
  std::function<void_(Scs::IServer_&,_int,_const_void_*,_unsigned_long)>::~function
            (&this->m_onReceiveData);
  std::function<void_(Scs::IServer_&,_int)>::~function(&this->m_onDisconnect);
  std::function<void_(Scs::IServer_&,_int)>::~function(&this->m_onConnect);
  std::function<void_(Scs::IServer_&)>::~function(&this->m_onStartListening);
  std::condition_variable::~condition_variable(&this->m_stateCondition);
  std::thread::~thread(&this->m_thread);
  std::shared_ptr<Scs::Socket>::~shared_ptr(&this->m_listenerSocket);
  std::__cxx11::
  list<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
  ::~list(&this->m_connectionList);
  IServer::~IServer(&this->super_IServer);
  return;
}

Assistant:

Server::~Server()
{
	LogWriteLine("Shutting down server.");
    m_shutDown = true;
	if (m_thread.joinable())
		m_thread.join();
}